

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_ubjson_size_type
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,pair<unsigned_long,_int> *result)

{
  byte bVar1;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  size_t sVar7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_R9;
  string last_token;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  char local_b8 [16];
  undefined **local_a8 [2];
  runtime_error local_98 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  result->first = 0xffffffffffffffff;
  result->second = 0;
  pbVar5 = (byte *)(this->ia).end;
  sVar7 = this->chars_read + 1;
  pbVar4 = (byte *)(this->ia).current;
  do {
    pbVar3 = pbVar4;
    this->chars_read = sVar7;
    if (pbVar3 == pbVar5) {
      this->current = -1;
      goto LAB_0068bbee;
    }
    bVar1 = *pbVar3;
    pbVar4 = pbVar3 + 1;
    sVar7 = sVar7 + 1;
    (this->ia).current = (char *)pbVar4;
    this->current = (uint)bVar1;
  } while (bVar1 == 0x4e);
  if (bVar1 == 0x23) {
LAB_0068bbce:
    bVar2 = get_ubjson_size_value(this,&result->first);
    return bVar2;
  }
  if (bVar1 == 0x24) {
    this->chars_read = sVar7;
    if (pbVar4 == pbVar5) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = (uint)*pbVar4;
      (this->ia).current = (char *)(pbVar3 + 2);
    }
    this->current = uVar6;
    result->second = uVar6;
    bVar2 = unexpect_eof(this,ubjson,"type");
    if (bVar2) {
      pbVar5 = (byte *)(this->ia).current;
      pbVar4 = (byte *)(this->ia).end;
      sVar7 = this->chars_read;
      do {
        sVar7 = sVar7 + 1;
        this->chars_read = sVar7;
        if (pbVar5 == pbVar4) {
          this->current = -1;
          break;
        }
        bVar1 = *pbVar5;
        pbVar5 = pbVar5 + 1;
        (this->ia).current = (char *)pbVar5;
        this->current = (uint)bVar1;
        if (bVar1 == 0x23) goto LAB_0068bbce;
      } while (bVar1 == 0x4e);
      bVar2 = unexpect_eof(this,ubjson,"value");
      if (bVar2) {
        get_token_string(&local_40,this);
        sVar7 = this->chars_read;
        this_00 = this->sax;
        std::operator+(&local_80,"expected \'#\' after type information; last byte: 0x",&local_40);
        local_c8._M_allocated_capacity = (size_type)local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_d8 + 0x10),"size","");
        exception_message(&local_60,this,ubjson,&local_80,(string *)(local_d8 + 0x10));
        local_d8[0] = null;
        local_d8._8_8_ = (object_t *)0x0;
        parse_error::
        create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((parse_error *)local_a8,(parse_error *)0x70,(int)sVar7,(size_t)&local_60,
                   (string *)local_d8,in_R9);
        bVar2 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::parse_error<nlohmann::detail::parse_error>
                          (this_00,sVar7,&local_40,(parse_error *)local_a8);
        local_a8[0] = &PTR__exception_0086b760;
        std::runtime_error::~runtime_error
                  ((runtime_error *)((long)&((parse_error *)local_a8)->super_exception + 0x10));
        std::exception::~exception((exception *)local_a8);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if ((char *)local_c8._M_allocated_capacity != local_b8) {
          operator_delete((void *)local_c8._M_allocated_capacity);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p == &local_40.field_2) {
          return bVar2;
        }
        operator_delete(local_40._M_dataplus._M_p);
        return bVar2;
      }
    }
    bVar2 = false;
  }
  else {
LAB_0068bbee:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool get_ubjson_size_type(std::pair<std::size_t, char_int_type>& result)
    {
        result.first = string_t::npos; // size
        result.second = 0; // type

        get_ignore_noop();

        if (current == '$')
        {
            result.second = get();  // must not ignore 'N', because 'N' maybe the type
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::ubjson, "type")))
            {
                return false;
            }

            get_ignore_noop();
            if (JSON_HEDLEY_UNLIKELY(current != '#'))
            {
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::ubjson, "value")))
                {
                    return false;
                }
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format_t::ubjson, "expected '#' after type information; last byte: 0x" + last_token, "size"), BasicJsonType()));
            }

            return get_ubjson_size_value(result.first);
        }

        if (current == '#')
        {
            return get_ubjson_size_value(result.first);
        }

        return true;
    }